

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_gzip_external(CImg<unsigned_char> *this,char *filename)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  FILE *pFVar8;
  char *pcVar9;
  CImg<char> *pCVar10;
  char *pcVar11;
  CImgIOException *pCVar12;
  long lVar13;
  ulong __n;
  char cVar14;
  char cVar15;
  char *pcVar16;
  uint uVar17;
  CImg<char> filename_tmp;
  CImg<char> command;
  CImg<char> body;
  CImg<char> local_70;
  CImg<char> local_50;
  
  if (filename == (char *)0x0) {
    pCVar12 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar16 = "non-";
    if (this->_is_shared != false) {
      pcVar16 = "";
    }
    CImgIOException::CImgIOException
              (pCVar12,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_gzip_external(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar16,"unsigned char");
    __cxa_throw(pCVar12,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  if ((*filename != '-') || ((pFVar8 = _stdin, filename[1] != '.' && (filename[1] != '\0')))) {
    pFVar8 = fopen(filename,"rb");
  }
  if (pFVar8 == (FILE *)0x0) {
    pCVar12 = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgIOException::CImgIOException
              (pCVar12,"cimg::fopen(): Failed to open file \'%s\' with mode \'%s\'.",filename,"rb");
    __cxa_throw(pCVar12,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  fclose(pFVar8);
  CImg<char>::CImg(&command,0x400,1,1,1);
  CImg<char>::CImg(&filename_tmp,0x100,1,1,1);
  CImg<char>::CImg(&body,0x100,1,1,1);
  pcVar16 = body._data;
  pcVar11 = filename;
  do {
    pcVar9 = pcVar11;
    pcVar4 = strchr(pcVar9,0x2e);
    pcVar11 = pcVar4 + 1;
  } while (filename <= pcVar4 + 1);
  if (pcVar9 == filename) {
    if (pcVar16 != (char *)0x0) {
      strcpy(pcVar16,filename);
    }
    sVar6 = strlen(filename);
    pcVar9 = filename + sVar6;
  }
  else if (pcVar16 != (char *)0x0) {
    uVar17 = ~(uint)filename + (int)pcVar9;
    if (uVar17 != 0) {
      memcpy(pcVar16,filename,(ulong)uVar17);
    }
    pcVar16[uVar17] = '\0';
  }
  pcVar16 = body._data;
  pcVar11 = body._data;
  if (body._data == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    do {
      pcVar4 = pcVar11;
      pcVar5 = strchr(pcVar4,0x2e);
      pcVar11 = pcVar5 + 1;
    } while (pcVar16 <= pcVar5 + 1);
    if (pcVar4 == pcVar16) {
      sVar6 = strlen(pcVar16);
      pcVar4 = pcVar16 + sVar6;
    }
  }
  do {
    sVar6 = strlen(pcVar9);
    pcVar16 = filename_tmp._data;
    uVar17 = filename_tmp._width;
    iVar2 = (int)sVar6;
    iVar3 = 2;
    if (iVar2 < 2) {
      iVar3 = iVar2;
    }
    if ((iVar3 != -1) && (-1 < iVar2)) {
      iVar3 = 2;
      if (iVar2 < 2) {
        iVar3 = iVar2;
      }
      lVar13 = 0;
      do {
        cVar1 = pcVar9[lVar13];
        cVar14 = cVar1 + ' ';
        if ((byte)(cVar1 + 0xa5U) < 0xe6) {
          cVar14 = cVar1;
        }
        cVar1 = "%s.gz"[lVar13 + 3];
        cVar15 = cVar1 + ' ';
        if ((byte)(cVar1 + 0xa5U) < 0xe6) {
          cVar15 = cVar1;
        }
        if (cVar14 != cVar15) {
          iVar3 = iVar2;
          if (1 < iVar2) {
            iVar3 = 2;
          }
          if ((-1 < iVar2) && (iVar3 + 1 != (int)lVar13)) {
            if (*pcVar9 == '\0') {
              pcVar11 = cimg::temporary_path((char *)0x0,false);
              pcVar5 = cimg::filenamerand();
              goto LAB_0011dd06;
            }
            pcVar5 = cimg::temporary_path((char *)0x0,false);
            pcVar7 = cimg::filenamerand();
            pcVar11 = pcVar9;
            goto LAB_0011dcea;
          }
          break;
        }
        lVar13 = lVar13 + 1;
      } while (iVar3 + 1 != (int)lVar13);
    }
    if (*pcVar4 == '\0') {
      pcVar11 = cimg::temporary_path((char *)0x0,false);
      pcVar5 = cimg::filenamerand();
LAB_0011dd06:
      snprintf(pcVar16,(ulong)uVar17,"%s%c%s",pcVar11,0x2f,pcVar5);
    }
    else {
      pcVar5 = cimg::temporary_path((char *)0x0,false);
      pcVar7 = cimg::filenamerand();
      pcVar11 = pcVar4;
LAB_0011dcea:
      snprintf(pcVar16,(ulong)uVar17,"%s%c%s.%s",pcVar5,0x2f,pcVar7,pcVar11);
    }
    pFVar8 = fopen(filename_tmp._data,"rb");
    pcVar16 = command._data;
    if (pFVar8 == (FILE *)0x0) {
      pcVar9 = cimg::gunzip_path((char *)0x0,false);
      sVar6 = strlen(filename);
      CImg<char>::CImg(&local_50,filename,(int)sVar6 + 1,1,1,1,false);
      pCVar10 = CImg<char>::_system_strescape(&local_50);
      pcVar11 = pCVar10->_data;
      CImg<char>::string(&local_70,filename_tmp._data,true,false);
      pCVar10 = CImg<char>::_system_strescape(&local_70);
      snprintf(pcVar16,(ulong)command._width,"%s -c \"%s\" > \"%s\"",pcVar9,pcVar11,pCVar10->_data);
      if ((local_70._is_shared == false) && (local_70._data != (char *)0x0)) {
        operator_delete__(local_70._data);
      }
      if ((local_50._is_shared == false) && (local_50._data != (char *)0x0)) {
        operator_delete__(local_50._data);
      }
      pcVar16 = command._data;
      sVar6 = strlen(command._data);
      __n = sVar6 & 0xffffffff;
      if (__n != 0) {
        pcVar11 = (char *)operator_new__((ulong)((int)sVar6 + 0x10));
        strncpy(pcVar11,pcVar16,__n);
        builtin_strncpy(pcVar11 + __n," 2> /dev/null",0xe);
        system(pcVar11);
        operator_delete__(pcVar11);
      }
      pFVar8 = fopen(filename_tmp._data,"rb");
      if (pFVar8 == (FILE *)0x0) {
        pFVar8 = cimg::fopen(filename,"r");
        cimg::fclose(pFVar8);
        pCVar12 = (CImgIOException *)__cxa_allocate_exception(0x10);
        pcVar16 = "non-";
        if (this->_is_shared != false) {
          pcVar16 = "";
        }
        CImgIOException::CImgIOException
                  (pCVar12,
                   "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_gzip_external(): Failed to load file \'%s\' with external command \'gunzip\'."
                   ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                   (ulong)this->_spectrum,this->_data,pcVar16,"unsigned char",filename);
        __cxa_throw(pCVar12,&CImgIOException::typeinfo,CImgException::~CImgException);
      }
      if (((_stdin != pFVar8) && (_stdout != pFVar8)) && (uVar17 = fclose(pFVar8), uVar17 != 0)) {
        cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar17);
      }
      load(this,filename_tmp._data);
      remove(filename_tmp._data);
      if ((body._is_shared == false) && (body._data != (char *)0x0)) {
        operator_delete__(body._data);
      }
      if ((filename_tmp._is_shared == false) && (filename_tmp._data != (char *)0x0)) {
        operator_delete__(filename_tmp._data);
      }
      if ((command._is_shared == false) && (command._data != (char *)0x0)) {
        operator_delete__(command._data);
      }
      return this;
    }
    if (((_stdin != pFVar8) && (_stdout != pFVar8)) && (iVar3 = fclose(pFVar8), iVar3 != 0)) {
      cimg::warn("cimg::fclose(): Error code %d returned during file closing.");
    }
  } while( true );
}

Assistant:

CImg<T>& load_gzip_external(const char *const filename) {
      if (!filename)
        throw CImgIOException(_cimg_instance
                              "load_gzip_external(): Specified filename is (null).",
                              cimg_instance);
      std::fclose(cimg::fopen(filename,"rb"));            // Check if file exists.
      CImg<charT> command(1024), filename_tmp(256), body(256);
      const char
        *const ext = cimg::split_filename(filename,body),
        *const ext2 = cimg::split_filename(body,0);

      std::FILE *file = 0;
      do {
        if (!cimg::strcasecmp(ext,"gz")) {
          if (*ext2) cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s.%s",
                                   cimg::temporary_path(),cimg_file_separator,cimg::filenamerand(),ext2);
          else cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s",
                             cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        } else {
          if (*ext) cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s.%s",
                                  cimg::temporary_path(),cimg_file_separator,cimg::filenamerand(),ext);
          else cimg_snprintf(filename_tmp,filename_tmp._width,"%s%c%s",
                             cimg::temporary_path(),cimg_file_separator,cimg::filenamerand());
        }
        if ((file=std::fopen(filename_tmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,command._width,"%s -c \"%s\" > \"%s\"",
                    cimg::gunzip_path(),
                    CImg<charT>::string(filename)._system_strescape().data(),
                    CImg<charT>::string(filename_tmp)._system_strescape().data());
      cimg::system(command);
      if (!(file = std::fopen(filename_tmp,"rb"))) {
        cimg::fclose(cimg::fopen(filename,"r"));
        throw CImgIOException(_cimg_instance
                              "load_gzip_external(): Failed to load file '%s' with external command 'gunzip'.",
                              cimg_instance,
                              filename);

      } else cimg::fclose(file);
      load(filename_tmp);
      std::remove(filename_tmp);
      return *this;
    }